

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O2

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint color;
  undefined8 uVar4;
  int iVar5;
  int g;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int color_00;
  int a;
  int b;
  int r;
  code *local_48;
  
  if (src->trueColor == 0) {
    color_00 = src->green[clrBack] * 0x100 + src->red[clrBack] * 0x10000 + src->blue[clrBack] +
               src->alpha[clrBack] * 0x1000000;
    local_48 = gdImageGetPixel;
  }
  else {
    local_48 = gdImageGetTrueColorPixel;
    color_00 = clrBack;
  }
  iVar5 = 0;
  iVar6 = 0;
  if (0 < iOffset) {
    iVar5 = iOffset;
    iVar6 = 0;
  }
  for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    gdImageSetPixel(dst,iVar6,uRow,color_00);
  }
  if (iVar5 < dst->sx) {
    gdImageSetPixel(dst,iVar5,uRow,color_00);
  }
  uVar7 = 0;
  for (iVar5 = 0; iVar5 < src->sx; iVar5 = iVar5 + 1) {
    uVar4 = (*local_48)(src,iVar5,uRow);
    color = (uint)uVar4;
    uVar3 = (uint)((ulong)uVar4 >> 8);
    uVar13 = (uint)((ulong)uVar4 >> 0x10);
    uVar7 = (uint)((ulong)uVar4 >> 0x18);
    if (src->trueColor == 0) {
      uVar8 = src->red[(int)color];
      uVar9 = src->green[(int)color];
      uVar10 = src->blue[(int)color];
      uVar11 = src->alpha[(int)color];
    }
    else {
      uVar8 = uVar13 & 0xff;
      uVar9 = uVar3 & 0xff;
      uVar10 = color & 0xff;
      uVar11 = uVar7 & 0x7f;
    }
    iVar6 = (int)((double)(int)uVar8 * dWeight);
    iVar14 = (int)((double)(int)uVar11 * dWeight);
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    iVar1 = (int)((double)(int)uVar9 * dWeight);
    if (0xfe < (int)((double)(int)uVar9 * dWeight)) {
      iVar1 = 0xff;
    }
    iVar2 = (int)((double)(int)uVar10 * dWeight);
    if (0xfe < (int)((double)(int)uVar10 * dWeight)) {
      iVar2 = 0xff;
    }
    if (0x7e < iVar14) {
      iVar14 = 0x7f;
    }
    iVar12 = 0xff;
    if (src->trueColor == 0) {
      r = (src->red[(int)color] - iVar6) + src->red[clrBack];
      g = (src->green[(int)color] - iVar1) + src->green[clrBack];
      b = (src->blue[(int)color] - iVar2) + src->blue[clrBack];
      uVar7 = src->alpha[(int)color];
      uVar13 = src->alpha[clrBack];
    }
    else {
      r = (((uint)clrBack >> 0x10 & 0xff) + (uVar13 & 0xff)) - iVar6;
      g = (((uint)clrBack >> 8 & 0xff) + (uVar3 & 0xff)) - iVar1;
      b = ((clrBack & 0xffU) + (color & 0xff)) - iVar2;
      uVar7 = uVar7 & 0x7f;
      uVar13 = (uint)clrBack >> 0x18 & 0x7f;
    }
    a = (uVar7 - iVar14) + uVar13;
    if (0xfe < r) {
      r = iVar12;
    }
    if (0xfe < g) {
      g = iVar12;
    }
    if (0xfe < b) {
      b = iVar12;
    }
    if (0x7e < a) {
      a = 0x7f;
    }
    if ((ignoretransparent == 0) || (color != dst->transparent)) {
      color = gdImageColorAllocateAlpha(dst,r,g,b,a);
      if (color == 0xffffffff) {
        color = gdImageColorClosestAlpha(dst,r,g,b,a);
      }
    }
    iVar12 = iOffset + iVar5;
    if ((-1 < iVar12) && (iVar12 < dst->sx)) {
      gdImageSetPixel(dst,iVar12,uRow,color);
    }
    uVar7 = iVar6 * 0x10000 + iVar2 + iVar1 * 0x100 + iVar14 * 0x1000000;
    clrBack = uVar7;
  }
  iVar5 = iVar5 + iOffset;
  if (iVar5 < dst->sx) {
    gdImageSetPixel(dst,iVar5,uRow,uVar7);
  }
  gdImageSetPixel(dst,iOffset,uRow,color_00);
  for (; iVar5 < dst->sx; iVar5 = iVar5 + 1) {
    gdImageSetPixel(dst,iVar5,uRow,color_00);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}